

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

Index __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_star_in_col(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                   *this,Index col)

{
  pointer pVVar1;
  pointer pAVar2;
  
  pVVar1 = (this->graph_->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = *(pointer *)&pVVar1[col].from_;
  while( true ) {
    if (pAVar2 == *(pointer *)((long)(pVVar1 + col) + 8)) {
      return 0xffffffffffffffff;
    }
    if ((this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_start[pAVar2->edge_] == 1) break;
    pAVar2 = pAVar2 + 1;
  }
  return pAVar2->vertex_;
}

Assistant:

typename Matching<GRAPH, COST, MASK>::Index
Matching<GRAPH, COST, MASK>::find_star_in_col(Index const col) const
{
    for (auto it = graph_.adjacenciesToVertexBegin(col);
         it != graph_.adjacenciesToVertexEnd(col); ++it)
        if (mask_[it->edge()] == STARRED)
            return it->vertex();

    return IDXMAX;
}